

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.h
# Opt level: O0

type_index cpp_db::type_of(value *v)

{
  bool bVar1;
  runtime_error *this;
  value_is_null *this_00;
  type_info *__rhs;
  value *v_local;
  
  bVar1 = std::any::has_value(v);
  if (!bVar1) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Invalid value object");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = is_null(v);
  if (!bVar1) {
    __rhs = std::any::type(v);
    std::type_index::type_index((type_index *)&v_local,__rhs);
    return (type_index)(type_info *)v_local;
  }
  this_00 = (value_is_null *)__cxa_allocate_exception(0x10);
  value_is_null::value_is_null(this_00);
  __cxa_throw(this_00,&value_is_null::typeinfo,value_is_null::~value_is_null);
}

Assistant:

inline std::type_index type_of(const value &v)
    {
		if (!v.has_value())
            throw std::runtime_error("Invalid value object");
        if (is_null(v))
            throw value_is_null{};
        return v.type();
    }